

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<long_double>(Capturer *this,size_t index,longdouble *value)

{
  enable_if_t<_::Catch::Detail::IsStreamInsertable<long_double>::value,_std::string> eStack_38;
  
  StringMaker<long_double,_void>::convert<long_double>(&eStack_38,value);
  captureValue(this,index,&eStack_38);
  std::__cxx11::string::~string((string *)&eStack_38);
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }